

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

bool __thiscall QFSFileEngine::rename_helper(QFSFileEngine *this,QString *newName,RenameMode mode)

{
  long lVar1;
  QAbstractFileEnginePrivate *pQVar2;
  char cVar3;
  code *pcVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_98;
  QSystemError local_80;
  QFileSystemEntry newEntry;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QAbstractFileEngine).d_ptr.d;
  if (mode == Rename) {
    pcVar4 = QFileSystemEngine::renameFile;
  }
  else {
    pcVar4 = QFileSystemEngine::renameOverwriteFile;
  }
  local_80.errorCode = 0;
  local_80.errorScope = NoError;
  newEntry._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
  newEntry.m_nativeFilePath.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  newEntry.m_nativeFilePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  newEntry.m_filePath.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  newEntry.m_nativeFilePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  newEntry.m_filePath.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  newEntry.m_filePath.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::QFileSystemEntry(&newEntry,newName);
  cVar3 = (*pcVar4)(pQVar2 + 1,&newEntry,&local_80);
  if (cVar3 == '\0') {
    QSystemError::toString((QString *)&QStack_98,&local_80);
    QAbstractFileEngine::setError
              (&this->super_QAbstractFileEngine,RenameError,(QString *)&QStack_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_98);
  }
  else {
    setFileEntry(this,&newEntry);
  }
  QFileSystemEntry::~QFileSystemEntry(&newEntry);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)cVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::rename_helper(const QString &newName, RenameMode mode)
{
    Q_D(QFSFileEngine);

    auto func = mode == Rename ? QFileSystemEngine::renameFile
                               : QFileSystemEngine::renameOverwriteFile;
    QSystemError error;
    auto newEntry = QFileSystemEntry(newName);
    const bool ret = func(d->fileEntry, newEntry, error);
    if (!ret) {
        setError(QFile::RenameError, error.toString());
        return false;
    }
    setFileEntry(std::move(newEntry));
    return true;
}